

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.cpp
# Opt level: O2

void * Rml::Detail::rmlui_align(size_t alignment,size_t size,void **ptr,size_t *space)

{
  void *pvVar1;
  long lVar2;
  
  pvVar1 = (void *)(-alignment & (long)*ptr + (alignment - 1));
  lVar2 = (long)pvVar1 - (long)*ptr;
  if (*space < size + lVar2) {
    return (void *)0x0;
  }
  *space = *space - lVar2;
  *ptr = pvVar1;
  return pvVar1;
}

Assistant:

inline void* rmlui_align(size_t alignment, size_t size, void*& ptr, size_t& space)
	{
#if defined(_MSC_VER)
		return std::align(alignment, size, ptr, space);
#else
		// std::align replacement to support compilers missing this feature.
		// From https://gcc.gnu.org/bugzilla/show_bug.cgi?id=57350

		uintptr_t pn = reinterpret_cast<uintptr_t>(ptr);
		uintptr_t aligned = (pn + alignment - 1) & -alignment;
		size_t padding = aligned - pn;
		if (space < size + padding)
			return nullptr;
		space -= padding;
		return ptr = reinterpret_cast<void*>(aligned);
#endif
	}